

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectest-interp.cc
# Opt level: O2

void __thiscall spectest::RegisterCommand::RegisterCommand(RegisterCommand *this)

{
  (this->super_CommandMixin<(wabt::CommandType)3>).super_Command.type = Register;
  (this->super_CommandMixin<(wabt::CommandType)3>).super_Command.line = 0;
  (this->super_CommandMixin<(wabt::CommandType)3>).super_Command._vptr_Command =
       (_func_int **)&PTR__RegisterCommand_001d4d30;
  (this->as)._M_dataplus._M_p = (pointer)&(this->as).field_2;
  (this->as)._M_string_length = 0;
  (this->as).field_2._M_local_buf[0] = '\0';
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  (this->name)._M_string_length = 0;
  (this->name).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

explicit Command(CommandType type) : type(type) {}